

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

int __thiscall google::protobuf::ServiceDescriptorProto::ByteSize(ServiceDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ServiceOptions *this_00;
  long lVar7;
  
  bVar1 = (byte)this->_has_bits_[0];
  iVar4 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      psVar2 = this->name_;
      uVar5 = (uint)psVar2->_M_string_length;
      iVar4 = 2;
      if (0x7f < uVar5) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        iVar4 = iVar4 + 1;
      }
      iVar4 = iVar4 + (int)psVar2->_M_string_length;
    }
    if ((this->_has_bits_[0] & 4) != 0) {
      this_00 = this->options_;
      if (this_00 == (ServiceOptions *)0x0) {
        this_00 = *(ServiceOptions **)(default_instance_ + 0x30);
      }
      uVar5 = ServiceOptions::ByteSize(this_00);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6 + 1;
    }
  }
  iVar6 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar5 = MethodDescriptorProto::ByteSize
                        ((MethodDescriptorProto *)
                         (this->method_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar4 = iVar4 + uVar5 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar6 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int ServiceDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  total_size += 1 * this->method_size();
  for (int i = 0; i < this->method_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->method(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}